

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O2

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandScope::compileDeclExpression
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandScope *this,
          Reader source,Resolver *resolver,ImplicitParams implicitMethodParams)

{
  anon_union_168_1_a8c68091_for_NullableValue<capnp::compiler::BrandedDecl>_2 *this_00;
  ErrorReporter *pEVar1;
  Reader source_00;
  Reader subSource;
  Reader source_01;
  Reader source_02;
  Reader source_03;
  Reader source_04;
  Reader source_05;
  Reader subSource_00;
  ImplicitParams implicitMethodParams_00;
  ImplicitParams implicitMethodParams_01;
  ImplicitParams implicitMethodParams_02;
  Reader name_00;
  bool bVar2;
  bool bVar3;
  Reader *params_1;
  ElementCount index;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  StringPtr message_03;
  StringPtr SVar7;
  Reader RVar8;
  undefined8 local_4d0;
  ArrayBuilder<capnp::compiler::BrandedDecl> compiledParams;
  Reader member;
  NullableValue<capnp::compiler::BrandedDecl> _decl656;
  NullableValue<capnp::compiler::BrandedDecl> _memberDecl658;
  IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
  local_310;
  undefined4 local_300;
  undefined4 local_2fc;
  int local_2f8;
  undefined4 local_2e0;
  undefined4 local_2dc;
  int local_2d8;
  undefined4 local_2c0;
  undefined4 local_2bc;
  int local_2b8;
  undefined4 local_2a0;
  undefined4 local_29c;
  int local_298;
  undefined8 local_290;
  Reader param;
  Reader name;
  Array<capnp::compiler::BrandedDecl> result_2;
  Reader name_2;
  ResolvedDecl local_158;
  Reader local_f0;
  Reader local_c0;
  Reader local_90;
  Reader local_60;
  
  if (source._reader.dataSize < 0x10) goto switchD_00152787_caseD_0;
  member._reader._32_8_ = source._reader._32_8_;
  switch(*source._reader.data) {
  case 0:
    goto switchD_00152787_caseD_0;
  case 1:
  case 2:
  case 3:
  case 4:
  case 6:
  case 7:
  case 8:
  case 0xd:
    message.content.size_ = 0xf;
    message.content.ptr = "Expected name.";
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
              (this->errorReporter,&source,message);
    goto switchD_00152787_caseD_0;
  case 5:
    Expression::Reader::getRelativeName(&name_2,&source);
    RVar8 = LocatedText::Reader::getValue(&name_2);
    member._reader.segment = RVar8.super_StringPtr.content.ptr;
    member._reader.capTable = RVar8.super_StringPtr.content.size_;
    uVar5 = (ulong)implicitMethodParams.params.reader.elementCount;
    uVar6 = 0;
    do {
      if (uVar5 == uVar6) {
        params_1 = (Reader *)member._reader.capTable;
        (**resolver->_vptr_Resolver)(&_decl656,resolver,member._reader.segment);
        kj::_::
        NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
        ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                         *)&_memberDecl658,
                        (NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                         *)&_decl656);
        if (_memberDecl658.isSet == true) {
          source_04._reader.pointerCount = source._reader.pointerCount;
          source_04._reader._38_2_ = source._reader._38_2_;
          source_04._reader.dataSize = source._reader.dataSize;
          source_04._reader.capTable = source._reader.capTable;
          source_04._reader.segment = source._reader.segment;
          source_04._reader.data = source._reader.data;
          source_04._reader.pointers = source._reader.pointers;
          source_04._reader.nestingLimit = source._reader.nestingLimit;
          source_04._reader._44_4_ = source._reader._44_4_;
          interpretResolve((BrandedDecl *)&_decl656,this,resolver,&_memberDecl658.field_1.value.body
                           ,source_04);
          if (_memberDecl658.field_1.value.body.tag == 1) {
            if (source._reader.dataSize < 0x40) {
              local_2c0 = 0;
              local_2bc = 0;
            }
            else {
              local_2c0 = *(undefined4 *)((long)source._reader.data + 4);
              local_2bc = 0;
              if (0x9f < source._reader.dataSize) {
                local_2bc = *(undefined4 *)((long)source._reader.data + 0x10);
              }
            }
            local_2b8 = 1;
            (*this->errorReporter->_vptr_ErrorReporter[2])();
            if (local_2b8 - 1U < 2) {
              local_2b8 = 0;
            }
          }
          kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                    (&__return_storage_ptr__->ptr,(BrandedDecl *)&_decl656);
          BrandedDecl::~BrandedDecl((BrandedDecl *)&_decl656);
          return __return_storage_ptr__;
        }
        pEVar1 = this->errorReporter;
        kj::str<char_const(&)[14],capnp::Text::Reader&>
                  ((String *)&_decl656,(kj *)"Not defined: ",(char (*) [14])&member,params_1);
        if (_decl656.field_1._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (char *)CONCAT44(_decl656._4_4_,_decl656._0_4_);
        }
        message_02.content.size_ = _decl656.field_1._0_8_ + (ulong)(_decl656.field_1._0_8_ == 0);
        message_02.content.ptr = pcVar4;
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>(pEVar1,&name_2,message_02);
        kj::Array<char>::~Array((Array<char> *)&_decl656);
        (__return_storage_ptr__->ptr).isSet = false;
        return __return_storage_ptr__;
      }
      index = (ElementCount)uVar6;
      capnp::_::ListReader::getStructElement
                ((StructReader *)&_decl656,&implicitMethodParams.params.reader,index);
      _memberDecl658._0_16_ = Declaration::BrandParameter::Reader::getName((Reader *)&_decl656);
      bVar3 = kj::ArrayPtr<const_char>::operator==
                        ((ArrayPtr<const_char> *)&_memberDecl658,(ArrayPtr<const_char> *)&member);
      uVar6 = uVar6 + 1;
    } while (!bVar3);
    if (implicitMethodParams.scopeId == 0) {
      _decl656.field_1.value.source._reader.capTable = (CapTableReader *)0x0;
      _decl656.field_1.value.source._reader.data = (void *)0x0;
      _decl656.field_1.value.brand.ptr = (BrandScope *)0x0;
      _decl656.field_1.value.source._reader.segment = (SegmentReader *)0x0;
      _decl656.field_1._96_8_ = 0;
      _decl656.field_1.value.brand.disposer = (Disposer *)0x0;
      _decl656.field_1.value.source._reader.pointers = (WirePointer *)0x0;
      _decl656.field_1._152_8_ = 0x7fffffff;
      _decl656.field_1._0_8_ = 0;
      _decl656.isSet = true;
      _decl656._1_3_ = 0;
      _decl656.field_1._8_4_ = index;
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                (&__return_storage_ptr__->ptr,(BrandedDecl *)&_decl656);
    }
    else {
      _decl656.field_1._8_4_ = index & 0xffff;
      _decl656.field_1.value.source._reader.capTable = (CapTableReader *)0x0;
      _decl656.field_1.value.source._reader.data = (void *)0x0;
      _decl656.field_1.value.brand.ptr = (BrandScope *)0x0;
      _decl656.field_1.value.source._reader.segment = (SegmentReader *)0x0;
      _decl656.field_1._96_8_ = 0;
      _decl656.field_1.value.brand.disposer = (Disposer *)0x0;
      _decl656.field_1.value.source._reader.pointers = (WirePointer *)0x0;
      _decl656.field_1._152_8_ = 0x7fffffff;
      _decl656.field_1._0_8_ = implicitMethodParams.scopeId;
      _decl656.isSet = true;
      _decl656._1_3_ = 0;
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                (&__return_storage_ptr__->ptr,(BrandedDecl *)&_decl656);
    }
    BrandedDecl::~BrandedDecl((BrandedDecl *)&_decl656);
    return __return_storage_ptr__;
  case 9:
    member._reader.nestingLimit = source._reader.nestingLimit;
    member._reader._44_4_ = source._reader._44_4_;
    member._reader.data = source._reader.data;
    member._reader.pointers = source._reader.pointers;
    member._reader.segment = source._reader.segment;
    member._reader.capTable = source._reader.capTable;
    Expression::Application::Reader::getFunction(&local_60,(Reader *)&member);
    implicitMethodParams_01.params.reader.step = implicitMethodParams.params.reader.step;
    implicitMethodParams_01.params.reader.elementCount =
         implicitMethodParams.params.reader.elementCount;
    source_02._reader.capTable = local_60._reader.capTable;
    source_02._reader.segment = local_60._reader.segment;
    source_02._reader.data = local_60._reader.data;
    source_02._reader.pointers = local_60._reader.pointers;
    source_02._reader.dataSize = local_60._reader.dataSize;
    source_02._reader.pointerCount = local_60._reader.pointerCount;
    source_02._reader._38_2_ = local_60._reader._38_2_;
    source_02._reader.nestingLimit = local_60._reader.nestingLimit;
    source_02._reader._44_4_ = local_60._reader._44_4_;
    implicitMethodParams_01.params.reader.segment = implicitMethodParams.params.reader.segment;
    implicitMethodParams_01.scopeId = implicitMethodParams.scopeId;
    implicitMethodParams_01.params.reader.capTable = implicitMethodParams.params.reader.capTable;
    implicitMethodParams_01.params.reader.ptr = implicitMethodParams.params.reader.ptr;
    implicitMethodParams_01.params.reader.structDataSize =
         implicitMethodParams.params.reader.structDataSize;
    implicitMethodParams_01.params.reader.structPointerCount =
         implicitMethodParams.params.reader.structPointerCount;
    implicitMethodParams_01.params.reader.elementSize =
         implicitMethodParams.params.reader.elementSize;
    implicitMethodParams_01.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
    implicitMethodParams_01.params.reader.nestingLimit =
         implicitMethodParams.params.reader.nestingLimit;
    implicitMethodParams_01.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
    compileDeclExpression
              ((Maybe<capnp::compiler::BrandedDecl> *)&_memberDecl658,this,source_02,resolver,
               implicitMethodParams_01);
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue(&_decl656,&_memberDecl658);
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&_memberDecl658);
    if (_decl656.isSet == true) {
      Expression::Application::Reader::getParams((Reader *)&name,(Reader *)&member);
      uVar5 = (ulong)(uint)name._reader.pointers;
      compiledParams.ptr =
           kj::_::HeapArrayDisposer::allocateUninitialized<capnp::compiler::BrandedDecl>(uVar5);
      compiledParams.endPtr = compiledParams.ptr + uVar5;
      compiledParams.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      bVar3 = false;
      compiledParams.pos = compiledParams.ptr;
      local_310.container = (Reader *)&name;
      for (local_310.index = 0; local_310.index != (uint)name._reader.pointers;
          local_310.index = local_310.index + 1) {
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
        ::operator*(&param,&local_310);
        if ((0xf < param._reader.dataSize) && (*param._reader.data == 1)) {
          pEVar1 = this->errorReporter;
          Expression::Param::Reader::getNamed((Reader *)&_memberDecl658,&param);
          message_00.content.size_ = 0x22;
          message_00.content.ptr = "Named parameter not allowed here.";
          ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader>
                    (pEVar1,(Reader *)&_memberDecl658,message_00);
        }
        Expression::Param::Reader::getValue(&local_c0,&param);
        implicitMethodParams_02.params.reader.step = implicitMethodParams.params.reader.step;
        implicitMethodParams_02.params.reader.elementCount =
             implicitMethodParams.params.reader.elementCount;
        source_03._reader.capTable = local_c0._reader.capTable;
        source_03._reader.segment = local_c0._reader.segment;
        source_03._reader.data = local_c0._reader.data;
        source_03._reader.pointers = local_c0._reader.pointers;
        source_03._reader.dataSize = local_c0._reader.dataSize;
        source_03._reader.pointerCount = local_c0._reader.pointerCount;
        source_03._reader._38_2_ = local_c0._reader._38_2_;
        source_03._reader.nestingLimit = local_c0._reader.nestingLimit;
        source_03._reader._44_4_ = local_c0._reader._44_4_;
        implicitMethodParams_02.params.reader.segment = implicitMethodParams.params.reader.segment;
        implicitMethodParams_02.scopeId = implicitMethodParams.scopeId;
        implicitMethodParams_02.params.reader.capTable = implicitMethodParams.params.reader.capTable
        ;
        implicitMethodParams_02.params.reader.ptr = implicitMethodParams.params.reader.ptr;
        implicitMethodParams_02.params.reader.structDataSize =
             implicitMethodParams.params.reader.structDataSize;
        implicitMethodParams_02.params.reader.structPointerCount =
             implicitMethodParams.params.reader.structPointerCount;
        implicitMethodParams_02.params.reader.elementSize =
             implicitMethodParams.params.reader.elementSize;
        implicitMethodParams_02.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
        implicitMethodParams_02.params.reader.nestingLimit =
             implicitMethodParams.params.reader.nestingLimit;
        implicitMethodParams_02.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
        compileDeclExpression
                  ((Maybe<capnp::compiler::BrandedDecl> *)&name_2,this,source_03,resolver,
                   implicitMethodParams_02);
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                  (&_memberDecl658,(NullableValue<capnp::compiler::BrandedDecl> *)&name_2);
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
                  ((NullableValue<capnp::compiler::BrandedDecl> *)&name_2);
        bVar2 = true;
        if (_memberDecl658.isSet == true) {
          BrandedDecl::BrandedDecl(compiledParams.pos,&_memberDecl658.field_1.value);
          compiledParams.pos = compiledParams.pos + 1;
          bVar2 = bVar3;
        }
        bVar3 = bVar2;
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&_memberDecl658);
      }
      this_00 = &_decl656.field_1;
      if (bVar3) {
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                  (&__return_storage_ptr__->ptr,&this_00->value);
      }
      else {
        result_2.size_ = ((long)compiledParams.pos - (long)compiledParams.ptr) / 0xa8;
        result_2.ptr = compiledParams.ptr;
        result_2.disposer = compiledParams.disposer;
        compiledParams.ptr = (BrandedDecl *)0x0;
        compiledParams.pos = (RemoveConst<capnp::compiler::BrandedDecl> *)0x0;
        compiledParams.endPtr = (BrandedDecl *)0x0;
        subSource_00._reader.pointerCount = source._reader.pointerCount;
        subSource_00._reader._38_2_ = source._reader._38_2_;
        subSource_00._reader.dataSize = source._reader.dataSize;
        subSource_00._reader.capTable = source._reader.capTable;
        subSource_00._reader.segment = source._reader.segment;
        subSource_00._reader.data = source._reader.data;
        subSource_00._reader.pointers = source._reader.pointers;
        subSource_00._reader.nestingLimit = source._reader.nestingLimit;
        subSource_00._reader._44_4_ = source._reader._44_4_;
        BrandedDecl::applyParams
                  ((Maybe<capnp::compiler::BrandedDecl> *)&name_2,&this_00->value,&result_2,
                   subSource_00);
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                  (&_memberDecl658,(NullableValue<capnp::compiler::BrandedDecl> *)&name_2);
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
                  ((NullableValue<capnp::compiler::BrandedDecl> *)&name_2);
        kj::Array<capnp::compiler::BrandedDecl>::~Array(&result_2);
        if (_memberDecl658.isSet == true) {
          kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                    (&__return_storage_ptr__->ptr,&_memberDecl658.field_1.value);
        }
        else {
          kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                    (&__return_storage_ptr__->ptr,&this_00->value);
        }
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&_memberDecl658);
      }
      kj::ArrayBuilder<capnp::compiler::BrandedDecl>::dispose(&compiledParams);
      goto LAB_00153595;
    }
    break;
  case 10:
    member._reader.nestingLimit = source._reader.nestingLimit;
    member._reader._44_4_ = source._reader._44_4_;
    member._reader.data = source._reader.data;
    member._reader.pointers = source._reader.pointers;
    member._reader.segment = source._reader.segment;
    member._reader.capTable = source._reader.capTable;
    Expression::Member::Reader::getParent(&local_90,&member);
    implicitMethodParams_00.params.reader.step = implicitMethodParams.params.reader.step;
    implicitMethodParams_00.params.reader.elementCount =
         implicitMethodParams.params.reader.elementCount;
    source_00._reader.capTable = local_90._reader.capTable;
    source_00._reader.segment = local_90._reader.segment;
    source_00._reader.data = local_90._reader.data;
    source_00._reader.pointers = local_90._reader.pointers;
    source_00._reader.dataSize = local_90._reader.dataSize;
    source_00._reader.pointerCount = local_90._reader.pointerCount;
    source_00._reader._38_2_ = local_90._reader._38_2_;
    source_00._reader.nestingLimit = local_90._reader.nestingLimit;
    source_00._reader._44_4_ = local_90._reader._44_4_;
    implicitMethodParams_00.params.reader.segment = implicitMethodParams.params.reader.segment;
    implicitMethodParams_00.scopeId = implicitMethodParams.scopeId;
    implicitMethodParams_00.params.reader.capTable = implicitMethodParams.params.reader.capTable;
    implicitMethodParams_00.params.reader.ptr = implicitMethodParams.params.reader.ptr;
    implicitMethodParams_00.params.reader.structDataSize =
         implicitMethodParams.params.reader.structDataSize;
    implicitMethodParams_00.params.reader.structPointerCount =
         implicitMethodParams.params.reader.structPointerCount;
    implicitMethodParams_00.params.reader.elementSize =
         implicitMethodParams.params.reader.elementSize;
    implicitMethodParams_00.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
    implicitMethodParams_00.params.reader.nestingLimit =
         implicitMethodParams.params.reader.nestingLimit;
    implicitMethodParams_00.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
    compileDeclExpression
              ((Maybe<capnp::compiler::BrandedDecl> *)&_memberDecl658,this,source_00,resolver,
               implicitMethodParams_00);
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue(&_decl656,&_memberDecl658);
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&_memberDecl658);
    if (_decl656.isSet == true) {
      Expression::Member::Reader::getName(&name,&member);
      SVar7.content = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&name);
      subSource._reader.pointerCount = source._reader.pointerCount;
      subSource._reader._38_2_ = source._reader._38_2_;
      subSource._reader.dataSize = source._reader.dataSize;
      subSource._reader.capTable = source._reader.capTable;
      subSource._reader.segment = source._reader.segment;
      subSource._reader.data = source._reader.data;
      subSource._reader.pointers = source._reader.pointers;
      subSource._reader.nestingLimit = source._reader.nestingLimit;
      subSource._reader._44_4_ = source._reader._44_4_;
      BrandedDecl::getMember
                ((Maybe<capnp::compiler::BrandedDecl> *)&name_2,&_decl656.field_1.value,SVar7,
                 subSource);
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                (&_memberDecl658,(NullableValue<capnp::compiler::BrandedDecl> *)&name_2);
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
                ((NullableValue<capnp::compiler::BrandedDecl> *)&name_2);
      if (_memberDecl658.isSet == true) {
        if (_memberDecl658.field_1.value.body.tag == 1) {
          if (source._reader.dataSize < 0x40) {
            local_300 = 0;
            local_2fc = 0;
          }
          else {
            local_300 = *(undefined4 *)((long)source._reader.data + 4);
            local_2fc = 0;
            if (0x9f < source._reader.dataSize) {
              local_2fc = *(undefined4 *)((long)source._reader.data + 0x10);
            }
          }
          local_2f8 = 1;
          (*this->errorReporter->_vptr_ErrorReporter[2])();
          if (local_2f8 - 1U < 2) {
            local_2f8 = 0;
          }
        }
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                  (&__return_storage_ptr__->ptr,&_memberDecl658.field_1.value);
      }
      else {
        pEVar1 = this->errorReporter;
        Expression::Member::Reader::getParent(&local_f0,&member);
        name_00._reader.capTable = (CapTableReader *)compiledParams.ptr;
        name_00._reader.segment = (SegmentReader *)local_4d0;
        name_00._reader.data = compiledParams.pos;
        name_00._reader.pointers = (WirePointer *)compiledParams.endPtr;
        name_00._reader._32_8_ = compiledParams.disposer;
        name_00._reader._40_8_ = member._reader.segment;
        expressionString(name_00);
        RVar8 = LocatedText::Reader::getValue(&name);
        compiledParams.ptr = RVar8.super_StringPtr.content.ptr;
        compiledParams.pos = RVar8.super_StringPtr.content.size_;
        kj::str<char_const(&)[2],kj::String,char_const(&)[24],capnp::Text::Reader,char_const(&)[2]>
                  ((String *)&name_2,(kj *)0x1f5394,(char (*) [2])&param,
                   (String *)"\' has no member named \'",(char (*) [24])&compiledParams,
                   (Reader *)0x1f5394,(char (*) [2])local_f0._reader.segment);
        if (name_2._reader.capTable == (CapTableReader *)0x0) {
          name_2._reader.segment = (SegmentReader *)0x20b013;
        }
        else {
        }
        message_03.content.size_ =
             (long)&(name_2._reader.capTable)->_vptr_CapTableReader +
             (ulong)(name_2._reader.capTable == (CapTableReader *)0x0);
        message_03.content.ptr = (char *)name_2._reader.segment;
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>(pEVar1,&name,message_03);
        kj::Array<char>::~Array((Array<char> *)&name_2);
        kj::Array<char>::~Array((Array<char> *)&param);
        (__return_storage_ptr__->ptr).isSet = false;
      }
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&_memberDecl658);
      goto LAB_00153595;
    }
    break;
  case 0xb:
    Expression::Reader::getAbsoluteName((Reader *)&member,&source);
    (*resolver->_vptr_Resolver[5])(&name_2,resolver);
    RVar8 = LocatedText::Reader::getValue((Reader *)&member);
    (**(code **)(*(long *)name_2._reader._32_8_ + 8))
              (&_decl656,name_2._reader._32_8_,RVar8.super_StringPtr.content.ptr,
               RVar8.super_StringPtr.content.size_);
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                     *)&_memberDecl658,
                    (NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                     *)&_decl656);
    if (_memberDecl658.isSet == true) {
      source_01._reader.pointerCount = source._reader.pointerCount;
      source_01._reader._38_2_ = source._reader._38_2_;
      source_01._reader.dataSize = source._reader.dataSize;
      source_01._reader.capTable = source._reader.capTable;
      source_01._reader.segment = source._reader.segment;
      source_01._reader.data = source._reader.data;
      source_01._reader.pointers = source._reader.pointers;
      source_01._reader.nestingLimit = source._reader.nestingLimit;
      source_01._reader._44_4_ = source._reader._44_4_;
      interpretResolve((BrandedDecl *)&_decl656,this,resolver,&_memberDecl658.field_1.value.body,
                       source_01);
      if (_memberDecl658.field_1.value.body.tag == 1) {
        if (source._reader.dataSize < 0x40) {
          local_2e0 = 0;
          local_2dc = 0;
        }
        else {
          local_2e0 = *(undefined4 *)((long)source._reader.data + 4);
          local_2dc = 0;
          if (0x9f < source._reader.dataSize) {
            local_2dc = *(undefined4 *)((long)source._reader.data + 0x10);
          }
        }
        local_2d8 = 1;
        (*this->errorReporter->_vptr_ErrorReporter[2])();
        if (local_2d8 - 1U < 2) {
          local_2d8 = 0;
        }
      }
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                (&__return_storage_ptr__->ptr,(BrandedDecl *)&_decl656);
      BrandedDecl::~BrandedDecl((BrandedDecl *)&_decl656);
      return __return_storage_ptr__;
    }
    pEVar1 = this->errorReporter;
    name_2._reader._0_16_ = LocatedText::Reader::getValue((Reader *)&member);
    kj::str<char_const(&)[14],capnp::Text::Reader>
              ((String *)&_decl656,(kj *)"Not defined: ",(char (*) [14])&name_2,(Reader *)&name_2);
    if (_decl656.field_1._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)CONCAT44(_decl656._4_4_,_decl656._0_4_);
    }
    message_01.content.size_ = _decl656.field_1._0_8_ + (ulong)(_decl656.field_1._0_8_ == 0);
    message_01.content.ptr = pcVar4;
    ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
              (pEVar1,(Reader *)&member,message_01);
    goto LAB_0015319f;
  case 0xc:
    Expression::Reader::getImport(&name_2,&source);
    RVar8 = LocatedText::Reader::getValue(&name_2);
    (*resolver->_vptr_Resolver[8])
              (&_decl656,resolver,RVar8.super_StringPtr.content.ptr,
               RVar8.super_StringPtr.content.size_);
    _memberDecl658.isSet = _decl656.isSet;
    if (_decl656.isSet == true) {
      _memberDecl658.field_1._32_8_ = _decl656.field_1._32_8_;
      _memberDecl658.field_1._16_4_ = _decl656.field_1._16_4_;
      _memberDecl658.field_1._20_4_ = _decl656.field_1._20_4_;
      _memberDecl658.field_1._24_4_ = _decl656.field_1._24_4_;
      _memberDecl658.field_1._28_4_ = _decl656.field_1._28_4_;
      _memberDecl658.field_1.value.body.tag = _decl656.field_1.value.body.tag;
      _memberDecl658.field_1._4_4_ = _decl656.field_1._4_4_;
      _memberDecl658.field_1._8_4_ = _decl656.field_1._8_4_;
      _memberDecl658.field_1._12_4_ = _decl656.field_1._12_4_;
      _memberDecl658.field_1._40_1_ = _decl656.field_1._40_1_;
      if (_decl656.field_1._40_1_ == '\x01') {
        _memberDecl658.field_1._80_8_ = _decl656.field_1._80_8_;
        _memberDecl658.field_1._88_8_ = _decl656.field_1._88_8_;
        _memberDecl658.field_1._64_4_ = _decl656.field_1._64_4_;
        _memberDecl658.field_1._68_4_ = _decl656.field_1._68_4_;
        _memberDecl658.field_1._72_4_ = _decl656.field_1._72_4_;
        _memberDecl658.field_1._76_4_ = _decl656.field_1._76_4_;
        _memberDecl658.field_1._48_4_ = _decl656.field_1._48_4_;
        _memberDecl658.field_1._52_4_ = _decl656.field_1._52_4_;
        _memberDecl658.field_1._56_4_ = _decl656.field_1._56_4_;
        _memberDecl658.field_1._60_4_ = _decl656.field_1._60_4_;
      }
      if (source._reader.dataSize < 0x40) {
        local_2a0 = 0;
        local_29c = 0;
      }
      else {
        local_2a0 = *(undefined4 *)((long)source._reader.data + 4);
        local_29c = 0;
        if (0x9f < source._reader.dataSize) {
          local_29c = *(undefined4 *)((long)source._reader.data + 0x10);
        }
      }
      local_298 = 1;
      local_290 = _memberDecl658.field_1._0_8_;
      (*this->errorReporter->_vptr_ErrorReporter[2])();
      if (local_298 - 1U < 2) {
        local_298 = 0;
      }
      local_158._12_4_ = _memberDecl658.field_1._12_4_;
      local_158.genericParamCount = _memberDecl658.field_1._8_4_;
      local_158.scopeId = CONCAT44(_memberDecl658.field_1._20_4_,_memberDecl658.field_1._16_4_);
      local_158._28_4_ = _memberDecl658.field_1._28_4_;
      local_158._24_4_ = _memberDecl658.field_1._24_4_;
      local_158.id = _memberDecl658.field_1._0_8_;
      local_158.resolver = (Resolver *)_memberDecl658.field_1._32_8_;
      local_158.brand.ptr.isSet = (bool)_memberDecl658.field_1._40_1_;
      if (_memberDecl658.field_1._40_1_ == '\x01') {
        local_158.brand.ptr.field_1.value._reader.segment =
             (SegmentReader *)CONCAT44(_memberDecl658.field_1._52_4_,_memberDecl658.field_1._48_4_);
        local_158.brand.ptr.field_1.value._reader.capTable =
             (CapTableReader *)CONCAT44(_memberDecl658.field_1._60_4_,_memberDecl658.field_1._56_4_)
        ;
        local_158.brand.ptr.field_1.value._reader.data =
             (void *)CONCAT44(_memberDecl658.field_1._68_4_,_memberDecl658.field_1._64_4_);
        local_158.brand.ptr.field_1.value._reader.pointers =
             (WirePointer *)CONCAT44(_memberDecl658.field_1._76_4_,_memberDecl658.field_1._72_4_);
        local_158.brand.ptr.field_1._32_8_ = _memberDecl658.field_1._80_8_;
        local_158.brand.ptr.field_1._40_8_ = _memberDecl658.field_1._88_8_;
      }
      kj::
      refcounted<capnp::compiler::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&,unsigned_int&,capnp::compiler::Resolver&>
                ((kj *)&member,this->errorReporter,(unsigned_long *)&_memberDecl658.field_1,
                 (uint *)((long)&_memberDecl658.field_1 + 8),
                 (Resolver *)_memberDecl658.field_1._32_8_);
      source_05._reader.pointerCount = source._reader.pointerCount;
      source_05._reader._38_2_ = source._reader._38_2_;
      source_05._reader.dataSize = source._reader.dataSize;
      source_05._reader.capTable = source._reader.capTable;
      source_05._reader.segment = source._reader.segment;
      source_05._reader.data = source._reader.data;
      source_05._reader.pointers = source._reader.pointers;
      source_05._reader.nestingLimit = source._reader.nestingLimit;
      source_05._reader._44_4_ = source._reader._44_4_;
      BrandedDecl::BrandedDecl
                ((BrandedDecl *)&_decl656,&local_158,
                 (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&member,source_05);
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                (&__return_storage_ptr__->ptr,(BrandedDecl *)&_decl656);
      BrandedDecl::~BrandedDecl((BrandedDecl *)&_decl656);
      kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose
                ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&member);
      return __return_storage_ptr__;
    }
    pEVar1 = this->errorReporter;
    RVar8 = LocatedText::Reader::getValue(&name_2);
    member._reader.segment = RVar8.super_StringPtr.content.ptr;
    member._reader.capTable = RVar8.super_StringPtr.content.size_;
    kj::str<char_const(&)[16],capnp::Text::Reader>
              ((String *)&_decl656,(kj *)"Import failed: ",(char (*) [16])&member,(Reader *)&member)
    ;
    if (_decl656.field_1._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)CONCAT44(_decl656._4_4_,_decl656._0_4_);
    }
    SVar7.content.size_ = _decl656.field_1._0_8_ + (ulong)(_decl656.field_1._0_8_ == 0);
    SVar7.content.ptr = pcVar4;
    ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>(pEVar1,&name_2,SVar7);
LAB_0015319f:
    kj::Array<char>::~Array((Array<char> *)&_decl656);
switchD_00152787_caseD_0:
    (__return_storage_ptr__->ptr).isSet = false;
    return __return_storage_ptr__;
  default:
    kj::_::unreachable();
  }
  (__return_storage_ptr__->ptr).isSet = false;
LAB_00153595:
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&_decl656);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<BrandedDecl> BrandScope::compileDeclExpression(
    Expression::Reader source, Resolver& resolver,
    ImplicitParams implicitMethodParams) {
  switch (source.which()) {
    case Expression::UNKNOWN:
      // Error reported earlier.
      return kj::none;

    case Expression::POSITIVE_INT:
    case Expression::NEGATIVE_INT:
    case Expression::FLOAT:
    case Expression::STRING:
    case Expression::BINARY:
    case Expression::LIST:
    case Expression::TUPLE:
    case Expression::EMBED:
      errorReporter.addErrorOn(source, "Expected name.");
      return kj::none;

    case Expression::RELATIVE_NAME: {
      auto name = source.getRelativeName();
      auto nameValue = name.getValue();

      // Check implicit method params first.
      for (auto i: kj::indices(implicitMethodParams.params)) {
        if (implicitMethodParams.params[i].getName() == nameValue) {
          if (implicitMethodParams.scopeId == 0) {
            return BrandedDecl::implicitMethodParam(i);
          } else {
            return BrandedDecl(Resolver::ResolvedParameter {
                implicitMethodParams.scopeId, static_cast<uint16_t>(i) },
                Expression::Reader());
          }
        }
      }

      KJ_IF_SOME(r, resolver.resolve(nameValue)) {
        auto result = interpretResolve(resolver, r, source);
        if (r.is<Resolver::ResolvedDecl>()){
          errorReporter.reportResolution(Resolution {
            /* .startByte = */ source.getStartByte(),
            /* .endByte = */ source.getEndByte(),
            /* .target = */ Resolution::Type { r.get<Resolver::ResolvedDecl>().id },
          });
        }
        return kj::mv(result);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", nameValue));
        return kj::none;
      }
    }

    case Expression::ABSOLUTE_NAME: {
      auto name = source.getAbsoluteName();
      KJ_IF_SOME(r, resolver.getTopScope().resolver->resolveMember(name.getValue())) {
        auto result = interpretResolve(resolver, r, source);
        if (r.is<Resolver::ResolvedDecl>()){
          errorReporter.reportResolution(Resolution {
            /* .startByte = */ source.getStartByte(),
            /* .endByte = */ source.getEndByte(),
            /* .target = */ Resolution::Type { r.get<Resolver::ResolvedDecl>().id },
          });
        }
        return kj::mv(result);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", name.getValue()));
        return kj::none;
      }
    }